

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::format_uint<1u,char,fmt::v10::appender,unsigned__int128>
                   (appender out,unsigned___int128 value,int num_digits,bool upper)

{
  undefined1 value_00 [16];
  undefined8 in_RDX;
  undefined8 in_RSI;
  buffer<char> *in_RDI;
  byte in_R8B;
  char buffer [129];
  char *ptr;
  undefined8 in_stack_fffffffffffffed8;
  char *end;
  undefined8 in_stack_fffffffffffffee0;
  char *begin;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffef8;
  char local_f8 [144];
  undefined8 local_68;
  undefined8 local_60;
  char *local_48;
  byte local_3d;
  undefined8 local_38;
  undefined8 local_30;
  buffer<char> *local_10;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_8;
  
  local_3d = in_R8B & 1;
  local_38 = in_RSI;
  local_30 = in_RDX;
  local_10 = in_RDI;
  to_unsigned<int>(0);
  local_48 = to_pointer<char>((buffer_appender<char>)in_stack_fffffffffffffef8.container,
                              in_stack_fffffffffffffef0);
  if (local_48 == (char *)0x0) {
    end = (char *)0x0;
    begin = (char *)0x0;
    local_f8[0x70] = '\0';
    local_f8[0x71] = '\0';
    local_f8[0x72] = '\0';
    local_f8[0x73] = '\0';
    local_f8[0x74] = '\0';
    local_f8[0x75] = '\0';
    local_f8[0x76] = '\0';
    local_f8[0x77] = '\0';
    local_f8[0x78] = '\0';
    local_f8[0x79] = '\0';
    local_f8[0x7a] = '\0';
    local_f8[0x7b] = '\0';
    local_f8[0x7c] = '\0';
    local_f8[0x7d] = '\0';
    local_f8[0x7e] = '\0';
    local_f8[0x7f] = '\0';
    local_f8[0x60] = '\0';
    local_f8[0x61] = '\0';
    local_f8[0x62] = '\0';
    local_f8[99] = '\0';
    local_f8[100] = '\0';
    local_f8[0x65] = '\0';
    local_f8[0x66] = '\0';
    local_f8[0x67] = '\0';
    local_f8[0x68] = '\0';
    local_f8[0x69] = '\0';
    local_f8[0x6a] = '\0';
    local_f8[0x6b] = '\0';
    local_f8[0x6c] = '\0';
    local_f8[0x6d] = '\0';
    local_f8[0x6e] = '\0';
    local_f8[0x6f] = '\0';
    local_f8[0x50] = '\0';
    local_f8[0x51] = '\0';
    local_f8[0x52] = '\0';
    local_f8[0x53] = '\0';
    local_f8[0x54] = '\0';
    local_f8[0x55] = '\0';
    local_f8[0x56] = '\0';
    local_f8[0x57] = '\0';
    local_f8[0x58] = '\0';
    local_f8[0x59] = '\0';
    local_f8[0x5a] = '\0';
    local_f8[0x5b] = '\0';
    local_f8[0x5c] = '\0';
    local_f8[0x5d] = '\0';
    local_f8[0x5e] = '\0';
    local_f8[0x5f] = '\0';
    local_f8[0x40] = '\0';
    local_f8[0x41] = '\0';
    local_f8[0x42] = '\0';
    local_f8[0x43] = '\0';
    local_f8[0x44] = '\0';
    local_f8[0x45] = '\0';
    local_f8[0x46] = '\0';
    local_f8[0x47] = '\0';
    local_f8[0x48] = '\0';
    local_f8[0x49] = '\0';
    local_f8[0x4a] = '\0';
    local_f8[0x4b] = '\0';
    local_f8[0x4c] = '\0';
    local_f8[0x4d] = '\0';
    local_f8[0x4e] = '\0';
    local_f8[0x4f] = '\0';
    local_f8[0x30] = '\0';
    local_f8[0x31] = '\0';
    local_f8[0x32] = '\0';
    local_f8[0x33] = '\0';
    local_f8[0x34] = '\0';
    local_f8[0x35] = '\0';
    local_f8[0x36] = '\0';
    local_f8[0x37] = '\0';
    local_f8[0x38] = '\0';
    local_f8[0x39] = '\0';
    local_f8[0x3a] = '\0';
    local_f8[0x3b] = '\0';
    local_f8[0x3c] = '\0';
    local_f8[0x3d] = '\0';
    local_f8[0x3e] = '\0';
    local_f8[0x3f] = '\0';
    local_f8[0x20] = '\0';
    local_f8[0x21] = '\0';
    local_f8[0x22] = '\0';
    local_f8[0x23] = '\0';
    local_f8[0x24] = '\0';
    local_f8[0x25] = '\0';
    local_f8[0x26] = '\0';
    local_f8[0x27] = '\0';
    local_f8[0x28] = '\0';
    local_f8[0x29] = '\0';
    local_f8[0x2a] = '\0';
    local_f8[0x2b] = '\0';
    local_f8[0x2c] = '\0';
    local_f8[0x2d] = '\0';
    local_f8[0x2e] = '\0';
    local_f8[0x2f] = '\0';
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    local_f8[0x18] = '\0';
    local_f8[0x19] = '\0';
    local_f8[0x1a] = '\0';
    local_f8[0x1b] = '\0';
    local_f8[0x1c] = '\0';
    local_f8[0x1d] = '\0';
    local_f8[0x1e] = '\0';
    local_f8[0x1f] = '\0';
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = '\0';
    local_f8[9] = '\0';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8[0x80] = 0;
    format_uint<1u,char,unsigned__int128>
              (local_f8,(unsigned___int128)ZEXT816(0),(int)local_38,SUB81(local_30,0));
    local_8.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v10::appender>
                   (begin,end,in_stack_fffffffffffffee8.container);
  }
  else {
    local_60 = local_30;
    local_68 = local_38;
    value_00._8_8_ = in_stack_fffffffffffffee0;
    value_00._0_8_ = in_stack_fffffffffffffed8;
    format_uint<1u,char,unsigned__int128>
              (local_48,(unsigned___int128)value_00,(int)local_38,SUB81(local_30,0));
    local_8.container = local_10;
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_8.container;
}

Assistant:

FMT_CONSTEXPR inline auto format_uint(It out, UInt value, int num_digits,
                                      bool upper = false) -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1] = {};
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}